

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexedByLookup(Parse *pParse,SrcList_item *pFrom)

{
  char *zRight;
  int iVar1;
  bool bVar2;
  Index *local_38;
  Index *pIdx;
  char *zIndexedBy;
  Table *pTab;
  SrcList_item *pFrom_local;
  Parse *pParse_local;
  
  if ((pFrom->pTab != (Table *)0x0) && (((byte)(pFrom->fg).field_0x1 >> 1 & 1) != 0)) {
    zRight = (pFrom->u1).zIndexedBy;
    local_38 = pFrom->pTab->pIndex;
    while( true ) {
      bVar2 = false;
      if (local_38 != (Index *)0x0) {
        iVar1 = sqlite3StrICmp(local_38->zName,zRight);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_38 = local_38->pNext;
    }
    if (local_38 == (Index *)0x0) {
      sqlite3ErrorMsg(pParse,"no such index: %s",zRight,0);
      pParse->checkSchema = '\x01';
      return 1;
    }
    pFrom->pIBIndex = local_38;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, struct SrcList_item *pFrom){
  if( pFrom->pTab && pFrom->fg.isIndexedBy ){
    Table *pTab = pFrom->pTab;
    char *zIndexedBy = pFrom->u1.zIndexedBy;
    Index *pIdx;
    for(pIdx=pTab->pIndex; 
        pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy); 
        pIdx=pIdx->pNext
    );
    if( !pIdx ){
      sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
      pParse->checkSchema = 1;
      return SQLITE_ERROR;
    }
    pFrom->pIBIndex = pIdx;
  }
  return SQLITE_OK;
}